

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

parser * parser_create(char *buffer,size_t buffer_size)

{
  map *pmVar1;
  parser *parser;
  size_t buffer_size_local;
  char *buffer_local;
  
  buffer_local = (char *)malloc(0x30);
  if (buffer_local == (char *)0x0) {
    buffer_local = (char *)0x0;
  }
  else {
    *(char **)buffer_local = buffer;
    *(size_t *)(buffer_local + 8) = buffer_size;
    buffer_local[0x10] = '\0';
    buffer_local[0x11] = '\0';
    buffer_local[0x12] = '\0';
    buffer_local[0x13] = '\0';
    buffer_local[0x14] = '\0';
    buffer_local[0x15] = '\0';
    buffer_local[0x16] = '\0';
    buffer_local[0x17] = '\0';
    buffer_local[0x18] = '\x01';
    buffer_local[0x19] = '\0';
    buffer_local[0x1a] = '\0';
    buffer_local[0x1b] = '\0';
    buffer_local[0x1c] = '\0';
    buffer_local[0x1d] = '\0';
    buffer_local[0x1e] = '\0';
    buffer_local[0x1f] = '\0';
    buffer_local[0x20] = '\x01';
    buffer_local[0x21] = '\0';
    buffer_local[0x22] = '\0';
    buffer_local[0x23] = '\0';
    buffer_local[0x24] = '\0';
    buffer_local[0x25] = '\0';
    buffer_local[0x26] = '\0';
    buffer_local[0x27] = '\0';
    pmVar1 = map_init();
    *(map **)(buffer_local + 0x28) = pmVar1;
    if (*(long *)(buffer_local + 0x28) == 0) {
      free(buffer_local);
      buffer_local = (char *)0x0;
    }
    else {
      map_set_entry_free_function(*(map **)(buffer_local + 0x28),hashmap_free_callback);
      map_set_setting_flag(*(map **)(buffer_local + 0x28),MAP_FLAG_FREE_ENTRY_KEY);
    }
  }
  return (parser *)buffer_local;
}

Assistant:

struct parser *parser_create(const char *buffer, size_t buffer_size)
{
        struct parser *parser = malloc(sizeof(struct parser));

        if (parser == NULL) {
                return NULL;
        }

        parser->buffer = buffer;
        parser->buffer_size = buffer_size;
        parser->pos = 0;
        parser->line_num = 1;
        parser->col_num = 1;
        parser->variables = map_init();

        if (parser->variables == NULL) {
                free(parser);

                return NULL;
        }

        // Set up hashmap
        map_set_entry_free_function(parser->variables, hashmap_free_callback);

        map_set_setting_flag(parser->variables, MAP_FLAG_FREE_ENTRY_KEY);

        return parser;
}